

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

void __thiscall Inferences::ContextSubsetReplacement::next(ContextSubsetReplacement *this)

{
  long in_RSI;
  
  next((InductionContext *)this,(ContextSubsetReplacement *)(in_RSI + -0x38));
  return;
}

Assistant:

InductionContext ContextSubsetReplacement::next()
{
  ASS(_ready);
  InductionContext context(_context._indTerms);
  for (unsigned i = 0; i < _context._indTerms.size(); i++) {
    _matchCount[i] = 0;
  }
  for (const auto& kv : _context._cls) {
    for (const auto& lit : kv.second) {
      auto tlit = transformLiteral(lit);
      // check if tlit has placeholders
      bool found = false;
      for (unsigned i = 0; i < _context._indTerms.size(); i++) {
        if (tlit->containsSubterm(TermList(getPlaceholderForTerm(_context._indTerms,i)))) {
          found = true;
          break;
        }
      }
      if (found) {
        context.insert(kv.first, tlit);
      }
    }
  }
  _ready = false;
  return context;
}